

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O1

void fadst4x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [12];
  int iVar18;
  uint uVar19;
  undefined3 in_register_00000011;
  int iVar20;
  uint uVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  int iVar27;
  short sVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  __m128i alVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  int iVar43;
  int iVar44;
  undefined1 auVar38 [16];
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  iVar18 = CONCAT31(in_register_00000011,cos_bit) - 10;
  uVar19 = av1_sinpi_arr_data[iVar18][2] << 0x10;
  uVar21 = av1_sinpi_arr_data[iVar18][1] & 0xffffU | uVar19;
  auVar30._4_4_ = uVar21;
  auVar30._0_4_ = uVar21;
  auVar30._8_4_ = uVar21;
  auVar30._12_4_ = uVar21;
  iVar20 = (av1_sinpi_arr_data[iVar18][4] & 0xffffU) + av1_sinpi_arr_data[iVar18][1] * -0x10000;
  auVar32._4_4_ = iVar20;
  auVar32._0_4_ = iVar20;
  auVar32._8_4_ = iVar20;
  auVar32._12_4_ = iVar20;
  uVar21 = av1_sinpi_arr_data[iVar18][3];
  uVar22 = av1_sinpi_arr_data[iVar18][4] << 0x10 | uVar21 & 0xffff;
  auVar53._4_4_ = uVar22;
  auVar53._0_4_ = uVar22;
  auVar53._8_4_ = uVar22;
  auVar53._12_4_ = uVar22;
  uVar19 = -uVar21 & 0xffff | uVar19;
  auVar24 = pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
  uVar23 = auVar24._0_4_;
  auVar35._4_4_ = uVar23;
  auVar35._0_4_ = uVar23;
  auVar35._8_4_ = uVar23;
  auVar35._12_4_ = uVar23;
  iVar18 = 1 << (cos_bit - 1U & 0x1f);
  alVar34 = *input;
  sVar10 = (short)input[1][0];
  sVar11 = *(short *)((long)input[1] + 2);
  sVar12 = *(short *)((long)input[1] + 4);
  sVar13 = *(short *)((long)input[1] + 6);
  alVar1 = input[2];
  alVar2 = input[3];
  auVar49._0_2_ = (short)alVar34[0];
  auVar48._0_2_ = sVar10 + auVar49._0_2_;
  sVar29 = sVar13 + alVar34[0]._6_2_;
  auVar17._2_2_ = (short)input[1][1] + (short)alVar34[1];
  auVar17._0_2_ = sVar29;
  auVar52._0_12_ = alVar34._0_12_;
  auVar52._12_2_ = alVar34[0]._6_2_;
  auVar52._14_2_ = sVar13;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_10_ = alVar34._0_10_;
  auVar51._10_2_ = sVar12;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._0_8_ = alVar34[0];
  auVar50._8_2_ = alVar34[0]._4_2_;
  auVar49._8_8_ = auVar50._8_8_;
  auVar49._6_2_ = sVar11;
  auVar49._4_2_ = alVar34[0]._2_2_;
  auVar49._2_2_ = sVar10;
  auVar42._0_12_ = alVar1._0_12_;
  auVar42._12_2_ = alVar1[0]._6_2_;
  auVar42._14_2_ = alVar2[0]._6_2_;
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_10_ = alVar1._0_10_;
  auVar41._10_2_ = alVar2[0]._4_2_;
  auVar40._10_6_ = auVar41._10_6_;
  auVar40._0_8_ = alVar1[0];
  auVar40._8_2_ = alVar1[0]._4_2_;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._6_2_ = alVar2[0]._2_2_;
  auVar39._0_4_ = (uint)alVar1[0];
  auVar39._4_2_ = alVar1[0]._2_2_;
  auVar38._4_12_ = auVar39._4_12_;
  auVar38._0_2_ = (undefined2)alVar1[0];
  auVar38._2_2_ = (short)alVar2[0];
  auVar17._4_8_ = 0;
  auVar5._12_2_ = sVar29;
  auVar5._0_12_ = auVar17 << 0x30;
  auVar14._6_8_ = 0;
  auVar14._0_6_ =
       (uint6)(CONCAT44(auVar5._10_4_,CONCAT22(sVar12 + alVar34[0]._4_2_,sVar29)) >> 0x10);
  auVar48._6_8_ = SUB148(auVar14 << 0x40,6);
  auVar48._4_2_ = sVar11 + alVar34[0]._2_2_;
  auVar48._2_2_ = 0;
  auVar48._14_2_ = 0;
  auVar3._10_2_ = 0;
  auVar3._0_10_ = auVar41._0_10_;
  auVar3._12_2_ = alVar1[0]._6_2_;
  auVar6._8_2_ = alVar1[0]._4_2_;
  auVar6._0_8_ = auVar40._0_8_;
  auVar6._10_4_ = auVar3._10_4_;
  auVar15._6_8_ = 0;
  auVar15._0_6_ = auVar6._8_6_;
  auVar8._4_2_ = alVar1[0]._2_2_;
  auVar8._0_4_ = auVar39._0_4_;
  auVar8._6_8_ = SUB148(auVar15 << 0x40,6);
  auVar47._0_4_ = auVar39._0_4_ & 0xffff;
  auVar47._4_10_ = auVar8._4_10_;
  auVar47._14_2_ = 0;
  auVar4._10_2_ = 0;
  auVar4._0_10_ = alVar2._0_10_;
  auVar4._12_2_ = alVar2[0]._6_2_;
  auVar7._8_2_ = alVar2[0]._4_2_;
  auVar7._0_8_ = alVar2[0];
  auVar7._10_4_ = auVar4._10_4_;
  auVar16._6_8_ = 0;
  auVar16._0_6_ = auVar7._8_6_;
  auVar9._4_2_ = alVar2[0]._2_2_;
  auVar9._0_4_ = (uint)alVar2[0];
  auVar9._6_8_ = SUB148(auVar16 << 0x40,6);
  auVar46._0_4_ = (uint)alVar2[0] & 0xffff;
  auVar46._4_10_ = auVar9._4_10_;
  auVar46._14_2_ = 0;
  auVar31 = pmaddwd(auVar30,auVar49);
  auVar24 = pmaddwd(auVar53,auVar38);
  iVar20 = auVar24._0_4_ + auVar31._0_4_;
  iVar25 = auVar24._4_4_ + auVar31._4_4_;
  iVar26 = auVar24._8_4_ + auVar31._8_4_;
  iVar27 = auVar24._12_4_ + auVar31._12_4_;
  auVar31 = pmaddwd(auVar48,auVar35);
  auVar53 = pmaddwd(auVar49,auVar32);
  auVar24._4_4_ = uVar19;
  auVar24._0_4_ = uVar19;
  auVar24._8_4_ = uVar19;
  auVar24._12_4_ = uVar19;
  auVar24 = pmaddwd(auVar38,auVar24);
  iVar37 = auVar24._0_4_ + auVar53._0_4_;
  iVar43 = auVar24._4_4_ + auVar53._4_4_;
  iVar44 = auVar24._8_4_ + auVar53._8_4_;
  iVar45 = auVar24._12_4_ + auVar53._12_4_;
  auVar48 = pmaddwd(auVar47,auVar35);
  auVar53 = pmaddwd(auVar46,auVar35);
  auVar24 = ZEXT416(CONCAT31(in_register_00000011,cos_bit));
  auVar33._0_4_ = iVar20 + iVar18 >> auVar24;
  auVar33._4_4_ = iVar25 + iVar18 >> auVar24;
  auVar33._8_4_ = iVar26 + iVar18 >> auVar24;
  auVar33._12_4_ = iVar27 + iVar18 >> auVar24;
  auVar28._0_4_ = (auVar31._0_4_ + iVar18) - auVar53._0_4_ >> auVar24;
  auVar28._4_4_ = (auVar31._4_4_ + iVar18) - auVar53._4_4_ >> auVar24;
  auVar28._8_4_ = (auVar31._8_4_ + iVar18) - auVar53._8_4_ >> auVar24;
  auVar28._12_4_ = (auVar31._12_4_ + iVar18) - auVar53._12_4_ >> auVar24;
  auVar36._0_4_ = iVar37 + iVar18 >> auVar24;
  auVar36._4_4_ = iVar43 + iVar18 >> auVar24;
  auVar36._8_4_ = iVar44 + iVar18 >> auVar24;
  auVar36._12_4_ = iVar45 + iVar18 >> auVar24;
  auVar31._0_4_ = (iVar18 - iVar20) + iVar37 + auVar48._0_4_ * 3 >> auVar24;
  auVar31._4_4_ = (iVar18 - iVar25) + iVar43 + auVar48._4_4_ * 3 >> auVar24;
  auVar31._8_4_ = (iVar18 - iVar26) + iVar44 + auVar48._8_4_ * 3 >> auVar24;
  auVar31._12_4_ = (iVar18 - iVar27) + iVar45 + auVar48._12_4_ * 3 >> auVar24;
  alVar34 = (__m128i)packssdw(auVar33,auVar36);
  *output = alVar34;
  alVar34 = (__m128i)packssdw(auVar28,auVar31);
  output[1] = alVar34;
  alVar34 = (__m128i)packssdw(auVar36,(undefined1  [16])0x0);
  output[2] = alVar34;
  alVar34 = (__m128i)packssdw(auVar31,(undefined1  [16])0x0);
  output[3] = alVar34;
  return;
}

Assistant:

static void fadst4x4_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *sinpi = sinpi_arr(cos_bit);
  const __m128i sinpi_p01_p02 = pair_set_epi16(sinpi[1], sinpi[2]);
  const __m128i sinpi_p04_m01 = pair_set_epi16(sinpi[4], -sinpi[1]);
  const __m128i sinpi_p03_p04 = pair_set_epi16(sinpi[3], sinpi[4]);
  const __m128i sinpi_m03_p02 = pair_set_epi16(-sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_p03 = _mm_set1_epi16((int16_t)sinpi[3]);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  const __m128i in7 = _mm_add_epi16(input[0], input[1]);
  __m128i u[8], v[8];

  u[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u[1] = _mm_unpacklo_epi16(input[2], input[3]);
  u[2] = _mm_unpacklo_epi16(in7, __zero);
  u[3] = _mm_unpacklo_epi16(input[2], __zero);
  u[4] = _mm_unpacklo_epi16(input[3], __zero);

  v[0] = _mm_madd_epi16(u[0], sinpi_p01_p02);  // s0 + s2
  v[1] = _mm_madd_epi16(u[1], sinpi_p03_p04);  // s4 + s5
  v[2] = _mm_madd_epi16(u[2], sinpi_p03_p03);  // x1
  v[3] = _mm_madd_epi16(u[0], sinpi_p04_m01);  // s1 - s3
  v[4] = _mm_madd_epi16(u[1], sinpi_m03_p02);  // -s4 + s6
  v[5] = _mm_madd_epi16(u[3], sinpi_p03_p03);  // s4
  v[6] = _mm_madd_epi16(u[4], sinpi_p03_p03);

  u[0] = _mm_add_epi32(v[0], v[1]);
  u[1] = _mm_sub_epi32(v[2], v[6]);
  u[2] = _mm_add_epi32(v[3], v[4]);
  u[3] = _mm_sub_epi32(u[2], u[0]);
  u[4] = _mm_slli_epi32(v[5], 2);
  u[5] = _mm_sub_epi32(u[4], v[5]);
  u[6] = _mm_add_epi32(u[3], u[5]);

  v[0] = _mm_add_epi32(u[0], __rounding);
  v[1] = _mm_add_epi32(u[1], __rounding);
  v[2] = _mm_add_epi32(u[2], __rounding);
  v[3] = _mm_add_epi32(u[6], __rounding);

  u[0] = _mm_srai_epi32(v[0], cos_bit);
  u[1] = _mm_srai_epi32(v[1], cos_bit);
  u[2] = _mm_srai_epi32(v[2], cos_bit);
  u[3] = _mm_srai_epi32(v[3], cos_bit);

  output[0] = _mm_packs_epi32(u[0], u[2]);
  output[1] = _mm_packs_epi32(u[1], u[3]);
  output[2] = _mm_srli_si128(output[0], 8);
  output[3] = _mm_srli_si128(output[1], 8);
}